

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow_conflict *window)

{
  window->MemoryCompacted = true;
  window->MemoryDrawListIdxCapacity = (window->DrawList->IdxBuffer).Capacity;
  window->MemoryDrawListVtxCapacity = (window->DrawList->VtxBuffer).Capacity;
  ImVector<unsigned_int>::clear(&window->IDStack);
  ImDrawList::_ClearFreeMemory(window->DrawList);
  ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)&(window->DC).ChildWindows);
  ImVector<float>::clear((ImVector<float> *)&(window->DC).ItemWidthStack);
  ImVector<float>::clear((ImVector<float> *)&(window->DC).TextWrapPosStack);
  return;
}

Assistant:

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow* window)
{
    window->MemoryCompacted = true;
    window->MemoryDrawListIdxCapacity = window->DrawList->IdxBuffer.Capacity;
    window->MemoryDrawListVtxCapacity = window->DrawList->VtxBuffer.Capacity;
    window->IDStack.clear();
    window->DrawList->_ClearFreeMemory();
    window->DC.ChildWindows.clear();
    window->DC.ItemWidthStack.clear();
    window->DC.TextWrapPosStack.clear();
}